

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase646::run(TestCase646 *this)

{
  WaitScope *waitScope;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  WirePointer *pWVar3;
  Event **ppEVar4;
  Disposer *pDVar5;
  PromiseNode *pPVar6;
  ClientHook *pCVar7;
  PromiseFulfiller<void> *pPVar8;
  undefined8 uVar9;
  TransformPromiseNodeBase *pTVar10;
  socklen_t in_ECX;
  PromiseNode *pPVar11;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  int in_R8D;
  Disposer *disposerCopy;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar12;
  Own<capnp::ClientHook> OVar13;
  bool returned;
  bool destroyed;
  PromiseFulfillerPair<void> paf;
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  request;
  TestContext context;
  char local_36a;
  byte local_369;
  undefined1 local_368 [8];
  _Base_ptr p_Stack_360;
  Event *local_358;
  WirePointer *local_350;
  Event **local_348;
  Disposer *pDStack_340;
  TaskSet *local_338;
  Own<kj::_::PromiseNode> local_328;
  Own<kj::_::PromiseNode> local_318;
  _Base_ptr local_308;
  Own<capnp::ClientHook> local_300;
  Own<kj::_::PromiseNode> local_2f0;
  Own<kj::PromiseFulfiller<void>_> local_2e0;
  pointer_____offset_0x10___ *local_2d0;
  _Rb_tree_color local_2c8;
  undefined4 uStack_2c4;
  _Base_ptr p_Stack_2c0;
  ExceptionOrValue local_2b8;
  char local_158;
  Maybe<capnp::MessageSize> local_150;
  TestContext local_138;
  
  TestContext::TestContext(&local_138);
  kj::newPromiseAndFulfiller<void>();
  local_369 = 0;
  pTVar10 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar10,&local_2f0,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:653:46),_kj::_::PropagateException>
             ::anon_class_8_1_8c041cb9_for_func::operator());
  (pTVar10->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060dd00;
  pTVar10[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_369;
  local_368 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_0,kj::_::PropagateException>>
               ::instance;
  p_Stack_360 = (_Base_ptr)pTVar10;
  OVar12 = kj::heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_2b8,(Own<kj::_::PromiseNode> *)local_368);
  p_Var1 = p_Stack_360;
  local_318.disposer._0_4_ = local_2b8.exception.ptr._0_4_;
  local_318.disposer._4_4_ = local_2b8.exception.ptr._4_4_;
  local_318.ptr = (PromiseNode *)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  if (p_Stack_360 != (_Base_ptr)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_368)->arena->_vptr_Arena)
              (local_368,
               ((PromiseNode *)&p_Var1->_M_color)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&p_Var1->_M_color)->_vptr_PromiseNode,OVar12.ptr);
  }
  TestContext::connect((TestContext *)local_368,(int)&local_138,(sockaddr *)0x5,in_ECX);
  (*((PromiseNode *)&p_Stack_360->_M_color)->_vptr_PromiseNode[4])(&local_2b8);
  p_Var1 = p_Stack_360;
  local_2c8 = local_2b8.exception.ptr._0_4_;
  uStack_2c4 = local_2b8.exception.ptr._4_4_;
  p_Stack_2c0 = (_Base_ptr)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  local_2d0 = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  if (p_Stack_360 != (_Base_ptr)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_368)->arena->_vptr_Arena)
              (local_368,
               ((PromiseNode *)&p_Var1->_M_color)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&p_Var1->_M_color)->_vptr_PromiseNode);
  }
  local_36a = '\0';
  local_150.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::expectCancelRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
              *)&local_2b8,(Client *)&local_2d0,&local_150);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>>>
            ((kj *)&local_328,&local_2e0);
  pPVar11 = local_328.ptr;
  local_368 = (undefined1  [8])local_328.disposer;
  p_Stack_360 = (_Base_ptr)(local_328.ptr + 8);
  if (local_328.ptr == (PromiseNode *)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
  }
  local_328.ptr = (PromiseNode *)0x0;
  OVar13 = Capability::Client::makeLocalClient
                     ((Client *)&local_300,(Own<capnp::Capability::Server> *)local_368);
  p_Var1 = p_Stack_360;
  if (p_Stack_360 != (_Base_ptr)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_368)->arena->_vptr_Arena)
              (local_368,(*(_func_int ***)&p_Var1->_M_color)[-2] + (long)&p_Var1->_M_color,
               OVar13.ptr);
  }
  local_308 = (_Base_ptr)&Capability::Client::typeinfo;
  local_368 = (undefined1  [8])CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
  ;
  p_Stack_360 = (_Base_ptr)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  local_358 = (Event *)local_2b8.exception.ptr.field_1.value.ownFile.content.disposer;
  PointerBuilder::setCapability((PointerBuilder *)local_368,&local_300);
  pCVar7 = local_300.ptr;
  __buf = extraout_RDX;
  if (local_300.ptr != (ClientHook *)0x0) {
    local_300.ptr = (ClientHook *)0x0;
    (*(code *)*(local_300.disposer)->_vptr_Disposer)
              (local_300.disposer,pCVar7->_vptr_ClientHook[-2] + (long)&pCVar7->_vptr_ClientHook);
    __buf = extraout_RDX_00;
  }
  pPVar6 = local_328.ptr;
  if (local_328.ptr != (PromiseNode *)0x0) {
    local_328.ptr = (PromiseNode *)0x0;
    (*(code *)((SegmentReader *)&(local_328.disposer)->_vptr_Disposer)->arena->_vptr_Arena)
              (local_328.disposer,pPVar6->_vptr_PromiseNode[-2] + (long)&pPVar6->_vptr_PromiseNode);
    __buf = extraout_RDX_01;
  }
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
          *)local_368,(int)&local_2b8,__buf,(size_t)pPVar11,in_R8D);
  pTVar10 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar10,(Own<kj::_::PromiseNode> *)local_368,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:665:9),_kj::_::PropagateException>
             ::anon_class_8_1_d59fe34d_for_func::operator());
  (pTVar10->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060dd88;
  pTVar10[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_36a;
  local_328.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,capnp::_::(anonymous_namespace)::TestCase646::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_328.ptr = (PromiseNode *)pTVar10;
  OVar12 = kj::heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_308,&local_328);
  p_Var1 = local_308;
  pPVar11 = local_328.ptr;
  if ((TransformPromiseNodeBase *)local_328.ptr != (TransformPromiseNodeBase *)0x0) {
    local_328.ptr = (PromiseNode *)0x0;
    (**(local_328.disposer)->_vptr_Disposer)
              (local_328.disposer,
               ((PromiseNode *)&pPVar11->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar11->_vptr_PromiseNode)->_vptr_PromiseNode,OVar12.ptr);
  }
  pDVar5 = pDStack_340;
  ppEVar4 = local_348;
  if (local_348 != (Event **)0x0) {
    local_348 = (Event **)0x0;
    pDStack_340 = (Disposer *)0x0;
    (*(code *)local_338->errorHandler->_vptr_ErrorHandler)(local_338,ppEVar4,8,pDVar5,pDVar5,0);
  }
  pWVar3 = local_350;
  if (local_350 != (WirePointer *)0x0) {
    local_350 = (WirePointer *)0x0;
    (**local_358->_vptr_Event)
              (local_358,
               (long)&(pWVar3->offsetAndKind).value + (long)*(Event ***)((long)*pWVar3 + -0x10));
  }
  p_Var2 = p_Stack_360;
  if (p_Stack_360 != (_Base_ptr)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_368)->arena->_vptr_Arena)
              (local_368,(*(_func_int ***)&p_Var2->_M_color)[-2] + (long)&p_Var2->_M_color);
  }
  uVar9 = local_2b8.exception.ptr.field_1.value.description.content.ptr;
  if ((long *)local_2b8.exception.ptr.field_1.value.description.content.ptr != (long *)0x0) {
    local_2b8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    (**(code **)*(_func_int **)local_2b8.exception.ptr.field_1._32_8_)
              (local_2b8.exception.ptr.field_1._32_8_,
               (char *)(uVar9 + *(long *)(*(long *)uVar9 + -0x10)));
  }
  kj::_::yield();
  pTVar10 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar10,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:669:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar9 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar10->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060de10;
  local_368 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_2,kj::_::PropagateException>>
               ::instance;
  p_Stack_360 = (_Base_ptr)pTVar10;
  if ((_Base_ptr)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (_Base_ptr)0x0) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar9 + (long)(*(_func_int ***)uVar9)[-2]));
  }
  waitScope = &local_138.waitScope;
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_368,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  p_Var2 = p_Stack_360;
  if (p_Stack_360 != (_Base_ptr)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_368)->arena->_vptr_Arena)
              (local_368,
               ((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode);
  }
  kj::_::yield();
  pTVar10 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar10,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:670:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar9 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar10->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060de98;
  local_368 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_3,kj::_::PropagateException>>
               ::instance;
  p_Stack_360 = (_Base_ptr)pTVar10;
  if ((_Base_ptr)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (_Base_ptr)0x0) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar9 + (long)(*(_func_int ***)uVar9)[-2]));
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_368,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  p_Var2 = p_Stack_360;
  if (p_Stack_360 != (_Base_ptr)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_368)->arena->_vptr_Arena)
              (local_368,
               ((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode);
  }
  kj::_::yield();
  pTVar10 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar10,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:671:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar9 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar10->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060df20;
  local_368 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_4,kj::_::PropagateException>>
               ::instance;
  p_Stack_360 = (_Base_ptr)pTVar10;
  if ((_Base_ptr)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (_Base_ptr)0x0) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar9 + (long)(*(_func_int ***)uVar9)[-2]));
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_368,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  p_Var2 = p_Stack_360;
  if (p_Stack_360 != (_Base_ptr)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_368)->arena->_vptr_Arena)
              (local_368,
               ((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode);
  }
  kj::_::yield();
  pTVar10 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar10,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:672:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar9 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar10->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060dfa8;
  local_368 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_5,kj::_::PropagateException>>
               ::instance;
  p_Stack_360 = (_Base_ptr)pTVar10;
  if ((_Base_ptr)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (_Base_ptr)0x0) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar9 + (long)(*(_func_int ***)uVar9)[-2]));
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_368,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  p_Var2 = p_Stack_360;
  if (p_Stack_360 != (_Base_ptr)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_368)->arena->_vptr_Arena)
              (local_368,
               ((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode);
  }
  kj::_::yield();
  pTVar10 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar10,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:673:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar9 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar10->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060e030;
  local_368 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_6,kj::_::PropagateException>>
               ::instance;
  p_Stack_360 = (_Base_ptr)pTVar10;
  if ((_Base_ptr)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (_Base_ptr)0x0) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar9 + (long)(*(_func_int ***)uVar9)[-2]));
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_368,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  p_Var2 = p_Stack_360;
  if (p_Stack_360 != (_Base_ptr)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_368)->arena->_vptr_Arena)
              (local_368,
               ((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode);
  }
  kj::_::yield();
  pTVar10 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar10,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:674:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar9 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar10->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060e0b8;
  local_368 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_7,kj::_::PropagateException>>
               ::instance;
  p_Stack_360 = (_Base_ptr)pTVar10;
  if ((_Base_ptr)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (_Base_ptr)0x0) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar9 + (long)(*(_func_int ***)uVar9)[-2]));
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_368,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  p_Var2 = p_Stack_360;
  if (p_Stack_360 != (_Base_ptr)0x0) {
    p_Stack_360 = (_Base_ptr)0x0;
    (*(code *)((SegmentReader *)local_368)->arena->_vptr_Arena)
              (local_368,
               ((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&p_Var2->_M_color)->_vptr_PromiseNode);
  }
  if ((local_369 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2a5,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  if ((local_36a == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2a6,ERROR,"\"failed: expected \" \"!(returned)\"",
               (char (*) [29])"failed: expected !(returned)");
  }
  if ((_Base_ptr)local_300.disposer != (_Base_ptr)0x0) {
    (**(code **)*(pointer_____offset_0x10___ *)p_Var1)
              (p_Var1,*(long *)(*(long *)local_300.disposer + -0x10) +
                      (long)&(local_300.disposer)->_vptr_Disposer);
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl(&local_318,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  if (kj::_::Debug::minSeverity < 3 && local_369 == 0) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ab,ERROR,"\"failed: expected \" \"destroyed\"",
               (char (*) [27])"failed: expected destroyed");
  }
  if ((local_36a == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ac,ERROR,"\"failed: expected \" \"!(returned)\"",
               (char (*) [29])"failed: expected !(returned)");
  }
  p_Var1 = p_Stack_2c0;
  if (p_Stack_2c0 != (_Base_ptr)0x0) {
    p_Stack_2c0 = (_Base_ptr)0x0;
    (*(code *)**(undefined8 **)CONCAT44(uStack_2c4,local_2c8))
              ((undefined8 *)CONCAT44(uStack_2c4,local_2c8),
               (*(_func_int ***)&p_Var1->_M_color)[-2] + (long)&p_Var1->_M_color);
  }
  pPVar11 = local_318.ptr;
  if ((_Base_ptr)local_318.ptr != (_Base_ptr)0x0) {
    local_318.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_318.disposer._4_4_,(_Rb_tree_color)local_318.disposer)
    )((undefined8 *)CONCAT44(local_318.disposer._4_4_,(_Rb_tree_color)local_318.disposer),
      pPVar11->_vptr_PromiseNode[-2] + (long)&pPVar11->_vptr_PromiseNode);
  }
  pPVar8 = local_2e0.ptr;
  if ((_Base_ptr)local_2e0.ptr != (_Base_ptr)0x0) {
    local_2e0.ptr = (PromiseFulfiller<void> *)0x0;
    (*(code *)*(local_2e0.disposer)->_vptr_Disposer)
              (local_2e0.disposer,
               *(long *)(*(long *)pPVar8 + -0x10) + (long)&pPVar8->_vptr_PromiseFulfiller);
  }
  pPVar11 = local_2f0.ptr;
  if (local_2f0.ptr != (PromiseNode *)0x0) {
    local_2f0.ptr = (PromiseNode *)0x0;
    (**(local_2f0.disposer)->_vptr_Disposer)
              (local_2f0.disposer,pPVar11->_vptr_PromiseNode[-2] + (long)&pPVar11->_vptr_PromiseNode
              );
  }
  TestContext::~TestContext(&local_138);
  return;
}

Assistant:

TEST(Rpc, Cancelation) {
  // Tests allowCancellation().

  TestContext context;

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
      .castAs<test::TestMoreStuff>();

  kj::Promise<void> promise = nullptr;

  bool returned = false;
  {
    auto request = client.expectCancelRequest();
    request.setCap(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller)));
    promise = request.send().then(
        [&](Response<test::TestMoreStuff::ExpectCancelResults>&& response) {
      returned = true;
    }).eagerlyEvaluate(nullptr);
  }
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);

  // We can detect that the method was canceled because it will drop the cap.
  EXPECT_FALSE(destroyed);
  EXPECT_FALSE(returned);

  promise = nullptr;  // request cancellation
  destructionPromise.wait(context.waitScope);

  EXPECT_TRUE(destroyed);
  EXPECT_FALSE(returned);
}